

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O0

ElemVec __thiscall
lf::uscalfe::
ScalarLoadElementVectorProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:48:21)>_>
::Eval(ScalarLoadElementVectorProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:48:21)>_>
       *this,Entity *cell)

{
  Index *args_1;
  double dVar1;
  double dVar2;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  format_string_t<Eigen::Transpose<Eigen::Matrix<double,__1,_1>_>_> fmt;
  format_string_t<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1>_>,_const_double_&>
  fmt_00;
  format_string_t<const_lf::base::RefEl_&,_const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1>_>_>
  fmt_01;
  format_string_t<const_lf::base::RefEl_&,_Eigen::Matrix<double,__1,__1>_> fmt_02;
  size_type sVar3;
  long *plVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  size_type sVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var10;
  element_type *peVar11;
  MatrixXd *pMVar12;
  QuadRule *pQVar13;
  ulong uVar14;
  Index IVar15;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar16;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *pDVar17;
  CoeffReturnType pdVar18;
  reference pvVar19;
  StorageBaseType *matrix;
  Entity *in_RDX;
  Index extraout_RDX;
  ElemVec EVar20;
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_bb0;
  char *local_ba8;
  size_t local_ba0;
  source_loc local_b98;
  ConstColXpr local_b80;
  double local_b48;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_b40;
  Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_ae0;
  char *local_ad8;
  size_t local_ad0;
  source_loc local_ac8;
  size_type local_ab0;
  long k;
  vector<double,_std::allocator<double>_> fval;
  Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a88;
  char *local_a80;
  size_t local_a78;
  source_loc local_a70;
  allocator<char> local_a51;
  string local_a50;
  allocator<char> local_a29;
  string local_a28;
  allocator<char> local_a01;
  string local_a00;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  stringstream local_970 [8];
  stringstream ss_3;
  ostream local_960 [376];
  undefined1 local_7e8 [8];
  VectorXd determinants;
  source_loc local_7b0;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  stringstream local_6b0 [8];
  stringstream ss_2;
  ostream local_6a0 [383];
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  stringstream local_440 [8];
  stringstream ss_1;
  ostream local_430 [376];
  long *local_2b8;
  Geometry *geo_ptr;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  reference local_30;
  value_type *pfe;
  Entity *pEStack_20;
  RefEl ref_el;
  Entity *cell_local;
  ScalarLoadElementVectorProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:48:21)>_>
  *this_local;
  ElemVec *vec;
  
  pEStack_20 = in_RDX;
  iVar6 = (*in_RDX->_vptr_Entity[4])();
  pfe._7_1_ = (undefined1)iVar6;
  uVar7 = lf::base::RefEl::Id((RefEl *)((long)&pfe + 7));
  local_30 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
             operator[]((array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL> *)
                        (cell + 3),(ulong)uVar7);
  bVar5 = PrecomputedScalarReferenceFiniteElement<double>::isInitialized(local_30);
  if (!bVar5) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar9 = std::operator<<(local_1a8,"No local shape function information for entity type ");
    lf::base::operator<<(poVar9,(RefEl *)((long)&pfe + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"pfe.isInitialized()",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_211);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e8,&local_210,0x2c1,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"false",&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)((long)&geo_ptr + 7));
    lf::base::AssertionFailed(&local_258,&local_280,0x2c1,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&geo_ptr + 7));
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    abort();
  }
  iVar6 = (*pEStack_20->_vptr_Entity[3])();
  local_2b8 = (long *)CONCAT44(extraout_var,iVar6);
  if (local_2b8 == (long *)0x0) {
    std::__cxx11::stringstream::stringstream(local_440);
    std::operator<<(local_430,"Invalid geometry!");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"geo_ptr != nullptr",&local_461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_489);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_460,&local_488,0x2c5,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator(&local_489);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"false",&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_4f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"",&local_521);
    lf::base::AssertionFailed(&local_4d0,&local_4f8,0x2c5,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator(&local_521);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    abort();
  }
  iVar6 = (**(code **)*local_2b8)();
  if (iVar6 != 2) {
    std::__cxx11::stringstream::stringstream(local_6b0);
    std::operator<<(local_6a0,"Only 2D implementation available!");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d0,"(geo_ptr->DimLocal() == 2)",&local_6d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_6f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_6d0,&local_6f8,0x2c7,&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator(&local_6f9);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::allocator<char>::~allocator(&local_6d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"false",&local_741);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_768,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_769);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"",&local_791);
    lf::base::AssertionFailed(&local_740,&local_768,0x2c7,&local_790);
    std::__cxx11::string::~string((string *)&local_790);
    std::allocator<char>::~allocator(&local_791);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator(&local_769);
    std::__cxx11::string::~string((string *)&local_740);
    std::allocator<char>::~allocator(&local_741);
    abort();
  }
  p_Var10 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            ScalarLoadElementVectorProviderLogger();
  peVar11 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(p_Var10);
  spdlog::source_loc::source_loc
            (&local_7b0,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
             ,0x2ca,"Eval");
  plVar4 = local_2b8;
  pMVar12 = lf::base::RefEl::NodeCoords((RefEl *)((long)&pfe + 7));
  args_1 = &determinants.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
  (**(code **)(*plVar4 + 0x18))(args_1,plVar4,pMVar12);
  fmt_02.str_.size_ = 0xf;
  fmt_02.str_.data_ = "{}, shape = \n{}";
  loc.line = local_7b0.line;
  loc._12_4_ = local_7b0._12_4_;
  loc.filename = local_7b0.filename;
  loc.funcname = local_7b0.funcname;
  spdlog::logger::log<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (peVar11,loc,trace,fmt_02,(RefEl *)((long)&pfe + 7),
             (Matrix<double,__1,__1,_0,__1,__1> *)args_1);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &determinants.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  plVar4 = local_2b8;
  pQVar13 = PrecomputedScalarReferenceFiniteElement<double>::Qr(local_30);
  pMVar12 = quad::QuadRule::Points(pQVar13);
  (**(code **)(*plVar4 + 0x30))
            ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_7e8,plVar4,pMVar12);
  uVar14 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_7e8);
  pQVar13 = PrecomputedScalarReferenceFiniteElement<double>::Qr(local_30);
  sVar8 = quad::QuadRule::NumPoints(pQVar13);
  if (uVar14 != sVar8) {
    std::__cxx11::stringstream::stringstream(local_970);
    poVar9 = std::operator<<(local_960,"Mismatch ");
    IVar15 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                       ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_7e8);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,IVar15);
    poVar9 = std::operator<<(poVar9," <-> ");
    pQVar13 = PrecomputedScalarReferenceFiniteElement<double>::Qr(local_30);
    sVar8 = quad::QuadRule::NumPoints(pQVar13);
    std::ostream::operator<<(poVar9,sVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,"determinants.size() == pfe.Qr().NumPoints()",&local_991);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_9b9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_990,&local_9b8,0x2d1,&local_9e0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator(&local_9b9);
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator(&local_991);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a00,"false",&local_a01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a28,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_a29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a50,"",&local_a51);
    lf::base::AssertionFailed(&local_a00,&local_a28,0x2d1,&local_a50);
    std::__cxx11::string::~string((string *)&local_a50);
    std::allocator<char>::~allocator(&local_a51);
    std::__cxx11::string::~string((string *)&local_a28);
    std::allocator<char>::~allocator(&local_a29);
    std::__cxx11::string::~string((string *)&local_a00);
    std::allocator<char>::~allocator(&local_a01);
    abort();
  }
  p_Var10 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            ScalarLoadElementVectorProviderLogger();
  peVar11 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(p_Var10);
  spdlog::source_loc::source_loc
            (&local_a70,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
             ,0x2d4,"Eval");
  local_a80 = "LOCVEC({}): Metric factors :\n{}";
  local_a78 = 0x1f;
  local_a88.m_matrix =
       (non_const_type)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_7e8);
  fmt_01.str_.size_ = local_a78;
  fmt_01.str_.data_ = local_a80;
  loc_00.line = local_a70.line;
  loc_00._12_4_ = local_a70._12_4_;
  loc_00.filename = local_a70.filename;
  loc_00.funcname = local_a70.funcname;
  spdlog::logger::
  log<lf::base::RefEl_const&,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>
            (peVar11,loc_00,trace,fmt_01,(RefEl *)((long)&pfe + 7),&local_a88);
  fval.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  fval.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ =
       (*(local_30->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement
         [4])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,
             (uint *)&fval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  pQVar13 = PrecomputedScalarReferenceFiniteElement<double>::Qr(local_30);
  pMVar12 = quad::QuadRule::Points(pQVar13);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:48:21)>
  ::operator()((vector<double,_std::allocator<double>_> *)&k,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:48:21)>
                *)(cell + 1),pEStack_20,pMVar12);
  local_ab0 = 0;
  while( true ) {
    sVar3 = local_ab0;
    IVar15 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                       ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_7e8);
    if (IVar15 <= (long)sVar3) break;
    p_Var10 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              ScalarLoadElementVectorProviderLogger();
    peVar11 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(p_Var10);
    spdlog::source_loc::source_loc
              (&local_ac8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,0x2e0,"Eval");
    local_ad8 = "LOCVEC: [{}] -> [weight = {}]";
    local_ad0 = 0x1d;
    pQVar13 = PrecomputedScalarReferenceFiniteElement<double>::Qr(local_30);
    pDVar16 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              quad::QuadRule::Points(pQVar13);
    local_ae0.m_matrix =
         (non_const_type)
         Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(pDVar16);
    pQVar13 = PrecomputedScalarReferenceFiniteElement<double>::Qr(local_30);
    pDVar17 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
              quad::QuadRule::Weights(pQVar13);
    pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        (pDVar17,local_ab0);
    fmt_00.str_.size_ = local_ad0;
    fmt_00.str_.data_ = local_ad8;
    loc_01.line = local_ac8.line;
    loc_01._12_4_ = local_ac8._12_4_;
    loc_01.filename = local_ac8.filename;
    loc_01.funcname = local_ac8.funcname;
    spdlog::logger::
    log<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,double_const&>
              (peVar11,loc_01,trace,fmt_00,&local_ae0,pdVar18);
    pQVar13 = PrecomputedScalarReferenceFiniteElement<double>::Qr(local_30);
    pDVar17 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
              quad::QuadRule::Weights(pQVar13);
    pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        (pDVar17,local_ab0);
    dVar1 = *pdVar18;
    pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_7e8,
                         local_ab0);
    dVar2 = *pdVar18;
    pvVar19 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)&k,local_ab0);
    local_b48 = dVar1 * dVar2 * *pvVar19;
    pDVar16 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              PrecomputedScalarReferenceFiniteElement<double>::PrecompReferenceShapeFunctions
                        (local_30);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(&local_b80,pDVar16,local_ab0);
    matrix = (StorageBaseType *)
             Eigen::
             DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
             conjugate((DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                        *)&local_b80);
    Eigen::operator*(&local_b40,&local_b48,matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_b40);
    local_ab0 = local_ab0 + 1;
  }
  p_Var10 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            ScalarLoadElementVectorProviderLogger();
  peVar11 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(p_Var10);
  spdlog::source_loc::source_loc
            (&local_b98,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
             ,0x2e7,"Eval");
  local_ba8 = "LOCVEC = \n{}";
  local_ba0 = 0xc;
  local_bb0.m_matrix =
       (non_const_type)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  fmt.str_.size_ = local_ba0;
  fmt.str_.data_ = local_ba8;
  loc_02.line = local_b98.line;
  loc_02._12_4_ = local_b98._12_4_;
  loc_02.filename = local_b98.filename;
  loc_02.funcname = local_b98.funcname;
  spdlog::logger::log<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>
            (peVar11,loc_02,trace,fmt,&local_bb0);
  fval.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&k);
  if ((fval.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_7e8);
  EVar20.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  EVar20.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ElemVec)EVar20.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

typename ScalarLoadElementVectorProvider<SCALAR, MESH_FUNCTION>::ElemVec
ScalarLoadElementVectorProvider<SCALAR, MESH_FUNCTION>::Eval(
    const lf::mesh::Entity &cell) {
  // Type for source function
  using source_fn_t = mesh::utils::MeshFunctionReturnType<MESH_FUNCTION>;
  // Topological type of the cell
  const lf::base::RefEl ref_el{cell.RefEl()};
  // Obtain precomputed information about values of local shape functions
  // and their gradients at quadrature points.
  auto &pfe = fe_precomp_[ref_el.Id()];
  // Accident: cell is of a type not coverence by finite element specifications
  LF_ASSERT_MSG(
      pfe.isInitialized(),
      "No local shape function information for entity type " << ref_el);

  // Query the shape of the cell
  const lf::geometry::Geometry *geo_ptr = cell.Geometry();
  LF_ASSERT_MSG(geo_ptr != nullptr, "Invalid geometry!");
  LF_ASSERT_MSG((geo_ptr->DimLocal() == 2),
                "Only 2D implementation available!");
  SPDLOG_LOGGER_TRACE(ScalarLoadElementVectorProviderLogger(),
                      "{}, shape = \n{}", ref_el,
                      geo_ptr->Global(ref_el.NodeCoords()));

  // Obtain the metric factors for the quadrature points
  const Eigen::VectorXd determinants(
      geo_ptr->IntegrationElement(pfe.Qr().Points()));
  LF_ASSERT_MSG(
      determinants.size() == pfe.Qr().NumPoints(),
      "Mismatch " << determinants.size() << " <-> " << pfe.Qr().NumPoints());
  SPDLOG_LOGGER_TRACE(ScalarLoadElementVectorProviderLogger(),
                      "LOCVEC({}): Metric factors :\n{}", ref_el,
                      determinants.transpose());

  // Element vector
  ElemVec vec(pfe.NumRefShapeFunctions());
  vec.setZero();

  auto fval = f_(cell, pfe.Qr().Points());

  // Loop over quadrature points
  for (long k = 0; k < determinants.size(); ++k) {
    SPDLOG_LOGGER_TRACE(ScalarLoadElementVectorProviderLogger(),
                        "LOCVEC: [{}] -> [weight = {}]",
                        pfe.Qr().Points().transpose(), pfe.Qr().Weights()[k]);
    // Contribution of current quadrature point
    vec += (pfe.Qr().Weights()[k] * determinants[k] * fval[k]) *
           pfe.PrecompReferenceShapeFunctions().col(k).conjugate();
  }

  SPDLOG_LOGGER_TRACE(ScalarLoadElementVectorProviderLogger(), "LOCVEC = \n{}",
                      vec.transpose());

  return vec;
}